

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ImportBaseFuncWrapper::getLibName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  char *__s;
  storage_type *psVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x23])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    plVar2 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar1),&PENodeWrapper::typeinfo,
                                    &ImportBaseEntryWrapper::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      __s = (char *)(**(code **)(*plVar2 + 0x188))(plVar2);
      if (__s != (char *)0x0) {
        psVar3 = (storage_type *)strlen(__s);
        QVar4.m_data = psVar3;
        QVar4.m_size = (qsizetype)&local_38;
        QString::fromUtf8(QVar4);
        (__return_storage_ptr__->d).d = local_38;
        (__return_storage_ptr__->d).ptr = pcStack_30;
        goto LAB_0012f0d3;
      }
    }
  }
  QVar5.m_data = (storage_type *)0x0;
  QVar5.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar5);
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = pcStack_30;
LAB_0012f0d3:
  (__return_storage_ptr__->d).size = local_28;
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getLibName()
{
    ImportBaseEntryWrapper *p = dynamic_cast<ImportBaseEntryWrapper*>(this->getParentNode());
    if (!p) return "";
    
    char *libName = p->getLibraryName();
    if (!libName) return "";
    
    return QString(libName);
}